

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLMeshLoader.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL::MeshLoader::begin__polylist(MeshLoader *this,polylist__AttributeData *attributeData)

{
  MeshPrimitiveWithFaceVertexCount<int> *this_00;
  MaterialId val;
  long in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  Polylist *polylist;
  String *in_stack_ffffffffffffff18;
  Polylist *in_stack_ffffffffffffff20;
  int flags;
  MeshPrimitive *pMVar1;
  IFilePartLoader *in_stack_ffffffffffffff28;
  ArrayPrimitiveType<int> *in_stack_ffffffffffffff30;
  String *symbol;
  allocator<char> *__a;
  allocator<char> *__s;
  allocator<char> local_89;
  string local_88 [39];
  allocator<char> local_61;
  string local_60 [35];
  undefined1 local_3d;
  UniqueId local_30;
  MeshPrimitiveWithFaceVertexCount<int> *local_18;
  long local_10;
  
  *(undefined4 *)(in_RDI + 0x12) = 6;
  local_10 = in_RSI;
  this_00 = (MeshPrimitiveWithFaceVertexCount<int> *)operator_new(0x138);
  local_3d = 1;
  COLLADAFW::ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)520>::ID();
  IFilePartLoader::createUniqueId
            (in_stack_ffffffffffffff28,(ClassId)((ulong)in_stack_ffffffffffffff20 >> 0x20));
  COLLADAFW::Polylist::Polylist(in_stack_ffffffffffffff20,(UniqueId *)in_stack_ffffffffffffff18);
  flags = (int)((ulong)in_stack_ffffffffffffff20 >> 0x20);
  local_3d = 0;
  COLLADAFW::UniqueId::~UniqueId(&local_30);
  local_18 = this_00;
  COLLADAFW::MeshPrimitiveWithFaceVertexCount<int>::getGroupedVerticesVertexCountArray(this_00);
  COLLADAFW::ArrayPrimitiveType<int>::allocMemory
            (in_stack_ffffffffffffff30,(size_t)in_stack_ffffffffffffff28,flags);
  *(MeshPrimitiveWithFaceVertexCount<int> **)&in_RDI[6].field_2 = local_18;
  if (*(long *)(local_10 + 0x18) != 0) {
    symbol = (String *)in_RDI[5]._M_string_length;
    pMVar1 = *(MeshPrimitive **)&in_RDI[6].field_2;
    __a = *(allocator<char> **)(local_10 + 0x18);
    __s = &local_61;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(in_RDI,(char *)__s,__a);
    val = GeometryMaterialIdInfo::getMaterialId((GeometryMaterialIdInfo *)pMVar1,symbol);
    COLLADAFW::MeshPrimitive::setMaterialId(pMVar1,val);
    std::__cxx11::string::~string(local_60);
    std::allocator<char>::~allocator(&local_61);
    pMVar1 = (MeshPrimitive *)in_RDI[6].field_2._M_allocated_capacity;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(in_RDI,(char *)__s,__a);
    COLLADAFW::MeshPrimitive::setMaterial(pMVar1,in_stack_ffffffffffffff18);
    std::__cxx11::string::~string(local_88);
    std::allocator<char>::~allocator(&local_89);
  }
  return true;
}

Assistant:

bool MeshLoader::begin__polylist( const polylist__AttributeData& attributeData )
	{
		mCurrentPrimitiveType = POLYLIST;
        COLLADAFW::Polylist* polylist = new COLLADAFW::Polylist(createUniqueId(COLLADAFW::Polylist::ID()));
		polylist->getGroupedVerticesVertexCountArray().allocMemory((size_t)attributeData.count);
		mCurrentMeshPrimitive = polylist;
		if ( attributeData.material )
		{
			mCurrentMeshPrimitive->setMaterialId(mMaterialIdInfo.getMaterialId( attributeData.material ));
			mCurrentMeshPrimitive->setMaterial(attributeData.material);

		}
		return true;
	}